

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDG2Dot.h
# Opt level: O0

ostream * dg::llvmdg::anon_unknown_6::printLLVMVal(ostream *os,Value *val)

{
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  bool bVar1;
  ret_type this;
  ret_type this_00;
  BasicBlock *this_01;
  ulong uVar2;
  long in_RSI;
  ostream *in_RDI;
  size_t pos;
  string str;
  BasicBlock *B_1;
  Instruction *I;
  BasicBlock *B;
  raw_os_ostream ro;
  ostringstream ostr;
  Value *in_stack_fffffffffffffd98;
  raw_ostream *in_stack_fffffffffffffda0;
  raw_ostream *in_stack_fffffffffffffda8;
  raw_ostream *in_stack_fffffffffffffdb0;
  size_t in_stack_fffffffffffffdb8;
  raw_os_ostream local_1d8 [72];
  ostringstream local_190 [384];
  ostream *local_10;
  ostream *local_8;
  
  local_10 = in_RDI;
  if (in_RSI == 0) {
    std::operator<<(in_RDI,"(null)");
    local_8 = local_10;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_190);
    llvm::raw_os_ostream::raw_os_ostream
              ((raw_os_ostream *)in_stack_fffffffffffffda0,(ostream *)in_stack_fffffffffffffd98);
    bVar1 = llvm::isa<llvm::Function,llvm::Value_const*>((Value **)0x161cca);
    if (bVar1) {
      in_stack_fffffffffffffda0 =
           llvm::raw_ostream::operator<<
                     (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
      llvm::Value::getName();
      Str.Length = in_stack_fffffffffffffdb8;
      Str.Data = (char *)in_stack_fffffffffffffdb0;
      llvm::raw_ostream::operator<<(in_stack_fffffffffffffda8,Str);
    }
    else {
      this = llvm::dyn_cast<llvm::BasicBlock,llvm::Value_const>((Value *)in_stack_fffffffffffffda0);
      if (this == (ret_type)0x0) {
        this_00 = llvm::dyn_cast<llvm::Instruction,llvm::Value_const>
                            ((Value *)in_stack_fffffffffffffda0);
        if (this_00 == (ret_type)0x0) {
          llvm::operator<<(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        }
        else {
          this_01 = llvm::Instruction::getParent(this_00);
          if (this_01 == (BasicBlock *)0x0) {
            llvm::raw_ostream::operator<<
                      (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
          }
          else {
            llvm::BasicBlock::getParent(this_01);
            llvm::Value::getName();
            Str_02.Length = in_stack_fffffffffffffdb8;
            Str_02.Data = (char *)in_stack_fffffffffffffdb0;
            llvm::raw_ostream::operator<<(in_stack_fffffffffffffda8,Str_02);
            llvm::raw_ostream::operator<<
                      (in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
          }
          llvm::operator<<(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        }
      }
      else {
        llvm::BasicBlock::getParent(this);
        llvm::Value::getName();
        Str_00.Length = in_stack_fffffffffffffdb8;
        Str_00.Data = (char *)in_stack_fffffffffffffdb0;
        llvm::raw_ostream::operator<<(in_stack_fffffffffffffda8,Str_00);
        llvm::raw_ostream::operator<<(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
        llvm::raw_ostream::operator<<(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
        llvm::Value::getName();
        Str_01.Length = in_stack_fffffffffffffdb8;
        Str_01.Data = (char *)in_stack_fffffffffffffdb0;
        llvm::raw_ostream::operator<<(in_stack_fffffffffffffda8,Str_01);
      }
    }
    llvm::raw_ostream::flush(in_stack_fffffffffffffda0);
    std::__cxx11::ostringstream::str();
    uVar2 = std::__cxx11::string::length();
    if (0x32 < uVar2) {
      std::__cxx11::string::resize((ulong)&stack0xfffffffffffffdb0);
    }
    while (uVar2 = std::__cxx11::string::find((char)&stack0xfffffffffffffdb0,0x22),
          uVar2 != 0xffffffffffffffff) {
      std::__cxx11::string::replace((ulong)&stack0xfffffffffffffdb0,uVar2,(char *)0x1);
    }
    std::operator<<(local_10,(string *)&stack0xfffffffffffffdb0);
    local_8 = local_10;
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb0);
    llvm::raw_os_ostream::~raw_os_ostream(local_1d8);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return local_8;
}

Assistant:

inline std::ostream &printLLVMVal(std::ostream &os, const llvm::Value *val) {
    if (!val) {
        os << "(null)";
        return os;
    }

    std::ostringstream ostr;
    llvm::raw_os_ostream ro(ostr);

    if (llvm::isa<llvm::Function>(val)) {
        ro << "FUN " << val->getName();
    } else if (const auto *B = llvm::dyn_cast<llvm::BasicBlock>(val)) {
        ro << B->getParent()->getName() << "::";
        ro << "label " << val->getName();
    } else if (const auto *I = llvm::dyn_cast<llvm::Instruction>(val)) {
        const auto *const B = I->getParent();
        if (B) {
            ro << B->getParent()->getName() << "::";
        } else {
            ro << "<null>::";
        }
        ro << *val;
    } else {
        ro << *val;
    }

    ro.flush();

    // break the string if it is too long
    std::string str = ostr.str();
    if (str.length() > 50) {
        str.resize(40);
    }

    // escape the "
    size_t pos = 0;
    while ((pos = str.find('"', pos)) != std::string::npos) {
        str.replace(pos, 1, "\\\"");
        // we replaced one char with two, so we must shift after the new "
        pos += 2;
    }

    os << str;

    return os;
}